

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O1

void __thiscall
Secp256k1_EmptyContextErrorTest_Test::TestBody(Secp256k1_EmptyContextErrorTest_Test *this)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  initializer_list<cfd::core::ByteData> __l;
  ByteData actual;
  Secp256k1 secp;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> test_vector;
  allocator_type local_c1;
  ByteData local_c0;
  ByteData local_a8;
  AssertHelper local_90 [2];
  undefined1 local_80 [24];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  cfd::core::Secp256k1::Secp256k1((Secp256k1 *)(local_80 + 0x10),(void *)0x0);
  local_90[0].data_ = (AssertHelperData *)local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9"
             ,"");
  cfd::core::ByteData::ByteData(&local_c0,(string *)local_90);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe"
             ,"");
  cfd::core::ByteData::ByteData(&local_a8,(string *)local_50);
  __l._M_len = 2;
  __l._M_array = &local_c0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_68,__l,&local_c1);
  lVar3 = 0x18;
  do {
    pvVar1 = *(void **)((long)&local_c0.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_90[0].data_ != (AssertHelperData *)local_80) {
    operator_delete(local_90[0].data_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if ((bVar2) &&
     (cfd::core::Secp256k1::CombinePubkeySecp256k1Ec((vector *)&local_c0),
     (long *)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
    operator_delete(local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  testing::Message::Message((Message *)&local_c0);
  testing::internal::AssertHelper::AssertHelper
            (local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
             ,0x93,
             "Expected: ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_90,(Message *)&local_c0);
  testing::internal::AssertHelper::~AssertHelper(local_90);
  if ((long *)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((long *)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
      (**(code **)(*(long *)local_c0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_68);
  return;
}

Assistant:

TEST(Secp256k1, EmptyContextErrorTest) {
  struct secp256k1_context_struct *cxt = nullptr;
  Secp256k1 secp = Secp256k1(cxt);

  std::vector<ByteData> test_vector =
      { ByteData(
          "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9"),
          ByteData(
              "0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe") };
  EXPECT_THROW(ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector),
               CfdException);
}